

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

char * src_get_name(int converter_type)

{
  int in_EDI;
  char *desc;
  char *local_8;
  
  local_8 = sinc_get_name(in_EDI);
  if (((local_8 == (char *)0x0) && (local_8 = zoh_get_name(in_EDI), local_8 == (char *)0x0)) &&
     (local_8 = linear_get_name(in_EDI), local_8 == (char *)0x0)) {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *
src_get_name (int converter_type)
{	const char *desc ;

	if ((desc = sinc_get_name (converter_type)) != NULL)
		return desc ;

	if ((desc = zoh_get_name (converter_type)) != NULL)
		return desc ;

	if ((desc = linear_get_name (converter_type)) != NULL)
		return desc ;

	return NULL ;
}